

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedString *FS)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  uint NumSpaces;
  ulong uVar4;
  StringRef Str;
  StringRef Str_00;
  
  uVar2 = *(ulong *)(FS + 8);
  uVar4 = *(uint *)(FS + 0x10) - uVar2;
  if ((*(uint *)(FS + 0x10) < uVar2 || uVar4 == 0) || (iVar1 = *(int *)(FS + 0x14), iVar1 == 0)) {
    pcVar3 = *(char **)FS;
LAB_00177cb4:
    Str_00.Length = uVar2;
    Str_00.Data = pcVar3;
    operator<<(this,Str_00);
  }
  else {
    if (iVar1 == 3) {
      NumSpaces = (uint)(uVar4 >> 1);
      indent(this,NumSpaces);
      operator<<(this,*(StringRef *)FS);
      uVar4 = (ulong)((uint)uVar4 - NumSpaces);
    }
    else {
      if (iVar1 == 2) {
        indent(this,(uint)uVar4);
        pcVar3 = *(char **)FS;
        uVar2 = *(ulong *)(FS + 8);
        goto LAB_00177cb4;
      }
      if (iVar1 != 1) {
        llvm_unreachable_internal
                  ("Bad Justification",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                   ,0x163);
      }
      Str.Length = uVar2;
      Str.Data = *(char **)FS;
      operator<<(this,Str);
    }
    indent(this,(uint)uVar4);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedString &FS) {
  if (FS.Str.size() >= FS.Width || FS.Justify == FormattedString::JustifyNone) {
    this->operator<<(FS.Str);
    return *this;
  }
  const size_t Difference = FS.Width - FS.Str.size();
  switch (FS.Justify) {
  case FormattedString::JustifyLeft:
    this->operator<<(FS.Str);
    this->indent(Difference);
    break;
  case FormattedString::JustifyRight:
    this->indent(Difference);
    this->operator<<(FS.Str);
    break;
  case FormattedString::JustifyCenter: {
    int PadAmount = Difference / 2;
    this->indent(PadAmount);
    this->operator<<(FS.Str);
    this->indent(Difference - PadAmount);
    break;
  }
  default:
    llvm_unreachable("Bad Justification");
  }
  return *this;
}